

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator *cmp,
          Arena *arena)

{
  Node *pNVar1;
  _func_int **in_RDX;
  Node *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  
  MemTable::KeyComparator::KeyComparator
            ((KeyComparator *)in_RDI,
             (KeyComparator *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  (((InternalKeyComparator *)&in_RDI[1].key)->super_Comparator)._vptr_Comparator = in_RDX;
  pNVar1 = NewNode((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)0x0,
                   (char **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (int)((ulong)in_RDI >> 0x20));
  in_RDI[1].next_[0]._M_b._M_p = pNVar1;
  std::atomic<int>::atomic((atomic<int> *)in_RDI,in_stack_ffffffffffffffcc);
  Random::Random((Random *)
                 ((long)&(((InternalKeyComparator *)&in_RDI[2].key)->super_Comparator).
                         _vptr_Comparator + 4),0xdeadbeef);
  for (iVar2 = 0; iVar2 < 0xc; iVar2 = iVar2 + 1) {
    Node::SetNext(in_RDI,in_stack_ffffffffffffffcc,(Node *)0x119747);
  }
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}